

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O1

bool __thiscall re2::Backtracker::Try(Backtracker *this,int id,char *p)

{
  int iVar1;
  int iVar2;
  Inst *pIVar3;
  StringPiece *pSVar4;
  undefined8 uVar5;
  char *pcVar6;
  bool bVar7;
  uint uVar8;
  uint32 uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  LogMessage local_1b0;
  
  uVar8 = 0xffffffff;
  if (p < (this->text_).ptr_ + (this->text_).length_) {
    uVar8 = (uint)(byte)*p;
  }
  pIVar3 = this->prog_->inst_;
  uVar12 = pIVar3[id].out_opcode_;
  switch(uVar12 & 7) {
  case 0:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
               ,0xba,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Unexpected opcode: ",0x13);
    std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar3[id].out_opcode_ & 7);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  default:
    return false;
  case 2:
    uVar11 = uVar8 | 0x20;
    if (pIVar3[id].field_1.field_3.foldcase_ == '\0') {
      uVar11 = uVar8;
    }
    if (0x19 < uVar8 - 0x41) {
      uVar11 = uVar8;
    }
    if ((int)uVar11 < (int)(uint)pIVar3[id].field_1.field_3.lo_) {
      return false;
    }
    if ((int)(uint)pIVar3[id].field_1.field_3.hi_ < (int)uVar11) {
      return false;
    }
    p = p + 1;
    goto LAB_00121e8c;
  case 3:
    uVar10 = (ulong)pIVar3[id].field_1.out1_;
    if (uVar10 < 0x40) {
      pcVar6 = this->cap_[uVar10];
      this->cap_[uVar10] = p;
      bVar7 = Visit(this,uVar12 >> 4,p);
      if ((pIVar3[id].out_opcode_ & 7) != 3) {
        __assert_fail("(opcode()) == (kInstCapture)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",
                      0x6e,"int re2::Prog::Inst::cap()");
      }
      this->cap_[pIVar3[id].field_1.cap_] = pcVar6;
      return bVar7;
    }
    break;
  case 4:
    uVar8 = pIVar3[id].field_1.out1_;
    uVar9 = Prog::EmptyFlags(&this->context_,p);
    if ((uVar8 & ~uVar9) != 0) {
      return false;
    }
    uVar12 = pIVar3[id].out_opcode_;
    break;
  case 5:
    if ((this->endmatch_ == true) && ((this->context_).ptr_ + (this->context_).length_ != p)) {
      return false;
    }
    this->cap_[1] = p;
    pSVar4 = this->submatch_;
    if (pSVar4->ptr_ != (char *)0x0) {
      if (this->longest_ != true) {
        return true;
      }
      if (p <= pSVar4->ptr_ + pSVar4->length_) {
        return true;
      }
    }
    iVar1 = this->nsubmatch_;
    if (0 < (long)iVar1) {
      lVar13 = 0;
      do {
        uVar5 = *(undefined8 *)((long)this->cap_ + lVar13);
        iVar2 = *(int *)((long)this->cap_ + lVar13 + 8);
        *(undefined8 *)((long)&pSVar4->ptr_ + lVar13) = uVar5;
        *(int *)((long)&pSVar4->length_ + lVar13) = iVar2 - (int)uVar5;
        lVar13 = lVar13 + 0x10;
      } while ((long)iVar1 * 0x10 != lVar13);
      return true;
    }
    return true;
  case 6:
    break;
  }
LAB_00121e8c:
  bVar7 = Visit(this,uVar12 >> 4,p);
  return bVar7;
}

Assistant:

bool Backtracker::Try(int id, const char* p) {
  // Pick out byte at current position.  If at end of string,
  // have to explore in hope of finishing a match.  Use impossible byte -1.
  int c = -1;
  if (p < text_.end())
    c = *p & 0xFF;

  Prog::Inst* ip = prog_->inst(id);
  switch (ip->opcode()) {
    default:
      LOG(FATAL) << "Unexpected opcode: " << (int)ip->opcode();
      return false;  // not reached

    case kInstAltMatch:
      // Ignored.
      return false;

    case kInstByteRange:
      if (ip->Matches(c))
        return Visit(ip->out(), p+1);
      return false;

    case kInstCapture:
      if (0 <= ip->cap() && ip->cap() < arraysize(cap_)) {
        // Capture p to register, but save old value.
        const char* q = cap_[ip->cap()];
        cap_[ip->cap()] = p;
        bool ret = Visit(ip->out(), p);
        // Restore old value as we backtrack.
        cap_[ip->cap()] = q;
        return ret;
      }
      return Visit(ip->out(), p);

    case kInstEmptyWidth:
      if (ip->empty() & ~Prog::EmptyFlags(context_, p))
        return false;
      return Visit(ip->out(), p);

    case kInstNop:
      return Visit(ip->out(), p);

    case kInstMatch:
      // We found a match.  If it's the best so far, record the
      // parameters in the caller's submatch_ array.
      if (endmatch_ && p != context_.end())
        return false;
      cap_[1] = p;
      if (submatch_[0].data() == NULL ||           // First match so far ...
          (longest_ && p > submatch_[0].end())) {  // ... or better match
        for (int i = 0; i < nsubmatch_; i++)
          submatch_[i].set(cap_[2*i],
                           static_cast<int>(cap_[2*i+1] - cap_[2*i]));
      }
      return true;

    case kInstFail:
      return false;
  }
}